

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wapiti_wrap.cxx
# Opt level: O0

jboolean Java_fr_limsi_wapiti_WapitiJNI_opt_1s_1label_1get
                   (JNIEnv *jenv,jclass jcls,jlong jarg1,jobject jarg1_)

{
  _Bool result;
  opt_s *arg1;
  jboolean jresult;
  jobject jarg1__local;
  jlong jarg1_local;
  jclass jcls_local;
  JNIEnv *jenv_local;
  
  return *(byte *)(jarg1 + 0xd8) & 1;
}

Assistant:

SWIGEXPORT jboolean JNICALL Java_fr_limsi_wapiti_WapitiJNI_opt_1s_1label_1get(JNIEnv *jenv, jclass jcls, jlong jarg1, jobject jarg1_) {
  jboolean jresult = 0 ;
  opt_s *arg1 = (opt_s *) 0 ;
  bool result;
  
  (void)jenv;
  (void)jcls;
  (void)jarg1_;
  arg1 = *(opt_s **)&jarg1; 
  result = (bool) ((arg1)->label);
  jresult = (jboolean)result; 
  return jresult;
}